

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O1

void idx2::ForwardCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  undefined1 auVar1 [16];
  int iVar2;
  transform_info *ptVar3;
  char *__function;
  long lVar4;
  ulong uVar5;
  long lVar6;
  grid *pgVar7;
  undefined3 in_register_00000089;
  byte bVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [64];
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> ItEnd;
  grid_iterator<double> local_c0;
  int local_84;
  double local_80;
  transform_info *local_78;
  array<idx2::subband> *local_70;
  grid_iterator<double> local_68;
  
  local_80 = (double)CONCAT44(local_80._4_4_,CONCAT31(in_register_00000089,CoarsestLevel));
  local_84 = Iter;
  local_70 = Subbands;
  if (TransformDetails->StackSize != 0) {
    pgVar7 = (TransformDetails->StackGrids).Arr;
    uVar5 = 0;
    do {
      if (uVar5 == 0x20) {
        __function = "t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]";
        goto LAB_001a3433;
      }
      if (Vol->Type < __Invalid__) {
        iVar2 = (TransformDetails->StackAxes).Arr[uVar5];
        switch(Vol->Type) {
        case int8:
          if (iVar2 == 2) {
            FLiftCdf53Z<signed_char>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<signed_char>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<signed_char>(pgVar7,M3,Normal,Vol);
          }
          break;
        case uint8:
          if (iVar2 == 2) {
            FLiftCdf53Z<unsigned_char>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<unsigned_char>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<unsigned_char>(pgVar7,M3,Normal,Vol);
          }
          break;
        case int16:
          if (iVar2 == 2) {
            FLiftCdf53Z<short>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<short>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<short>(pgVar7,M3,Normal,Vol);
          }
          break;
        case uint16:
          if (iVar2 == 2) {
            FLiftCdf53Z<unsigned_short>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<unsigned_short>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<unsigned_short>(pgVar7,M3,Normal,Vol);
          }
          break;
        case int32:
          if (iVar2 == 2) {
            FLiftCdf53Z<int>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<int>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<int>(pgVar7,M3,Normal,Vol);
          }
          break;
        case uint32:
          if (iVar2 == 2) {
            FLiftCdf53Z<unsigned_int>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<unsigned_int>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<unsigned_int>(pgVar7,M3,Normal,Vol);
          }
          break;
        case int64:
          if (iVar2 == 2) {
            FLiftCdf53Z<long>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<long>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<long>(pgVar7,M3,Normal,Vol);
          }
          break;
        case uint64:
          if (iVar2 == 2) {
            FLiftCdf53Z<unsigned_long>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<unsigned_long>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<unsigned_long>(pgVar7,M3,Normal,Vol);
          }
          break;
        case float32:
          if (iVar2 == 2) {
            FLiftCdf53Z<float>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<float>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<float>(pgVar7,M3,Normal,Vol);
          }
          break;
        case float64:
          if (iVar2 == 2) {
            FLiftCdf53Z<double>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 1) {
            FLiftCdf53Y<double>(pgVar7,M3,Normal,Vol);
          }
          else if (iVar2 == 0) {
            FLiftCdf53X<double>(pgVar7,M3,Normal,Vol);
          }
        }
      }
      uVar5 = uVar5 + 1;
      pgVar7 = pgVar7 + 1;
    } while (uVar5 != (uint)TransformDetails->StackSize);
  }
  if (0 < local_70->Size) {
    local_78 = (transform_info *)&(TransformDetails->BasisNorms).WaveNorms;
    lVar6 = 0;
    bVar8 = SUB81(local_80,0);
    auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    do {
      if ((lVar6 == 0 & (bVar8 ^ 1)) == 0) {
        dVar12 = auVar13._0_8_;
        pgVar7 = (grid *)((local_70->Buffer).Data + lVar6 * 0x40);
        dVar9 = dVar12;
        if ((M3->field_0).field_0.X != 1) {
          iVar2 = (int)*(char *)((long)&pgVar7[2].super_extent.From + 3);
          if (*(char *)((long)&pgVar7[2].super_extent.From + 6) == '\0') {
            iVar2 = TransformDetails->NPasses * local_84 + iVar2;
            if (0x10 < iVar2) goto LAB_001a341e;
            iVar2 = iVar2 + -1;
            ptVar3 = TransformDetails;
          }
          else {
            iVar2 = TransformDetails->NPasses * local_84 + iVar2;
            ptVar3 = local_78;
            if (0xf < iVar2) goto LAB_001a341e;
          }
          dVar9 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
        }
        dVar11 = dVar12;
        if ((M3->field_0).field_0.Y != 1) {
          iVar2 = (int)*(char *)((long)&pgVar7[2].super_extent.From + 4);
          if (*(char *)((long)&pgVar7[2].super_extent.From + 7) == '\0') {
            iVar2 = TransformDetails->NPasses * local_84 + iVar2;
            if (0x10 < iVar2) goto LAB_001a341e;
            iVar2 = iVar2 + -1;
            ptVar3 = TransformDetails;
          }
          else {
            iVar2 = TransformDetails->NPasses * local_84 + iVar2;
            ptVar3 = local_78;
            if (0xf < iVar2) goto LAB_001a341e;
          }
          dVar11 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
        }
        if ((M3->field_0).field_0.Z != 1) {
          iVar2 = (int)*(char *)((long)&pgVar7[2].super_extent.From + 5);
          if ((char)pgVar7[2].super_extent.Dims == '\0') {
            iVar2 = TransformDetails->NPasses * local_84 + iVar2;
            if (0x10 < iVar2) goto LAB_001a341e;
            iVar2 = iVar2 + -1;
            ptVar3 = TransformDetails;
          }
          else {
            iVar2 = TransformDetails->NPasses * local_84 + iVar2;
            ptVar3 = local_78;
            if (0xf < iVar2) {
LAB_001a341e:
              __function = 
              "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]";
LAB_001a3433:
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,__function);
            }
          }
          dVar12 = (ptVar3->BasisNorms).ScalNorms.Arr[iVar2];
        }
        if (Vol->Type < __Invalid__) {
          local_80 = dVar9 * dVar11 * dVar12;
          switch(Vol->Type) {
          case int8:
            End<signed_char>((grid_iterator<signed_char> *)&local_68,pgVar7,Vol);
            Begin<signed_char>((grid_iterator<signed_char> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(char *)local_c0.Ptr = (char)(int)(local_80 * (double)(int)*(char *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.S.field_0.field_0.X + (long)local_c0.Ptr);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar4 -
                               (long)local_c0.D.field_0.field_0.X));
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar4 -
                                 local_c0.D.field_0.field_0.Y * lVar4));
                }
              }
            }
            break;
          case uint8:
            End<unsigned_char>((grid_iterator<unsigned_char> *)&local_68,pgVar7,Vol);
            Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(char *)local_c0.Ptr = (char)(int)(local_80 * (double)*(byte *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.S.field_0.field_0.X + (long)local_c0.Ptr);
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar4 -
                               (long)local_c0.D.field_0.field_0.X));
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar4 -
                                 local_c0.D.field_0.field_0.Y * lVar4));
                }
              }
            }
            break;
          case int16:
            End<short>((grid_iterator<short> *)&local_68,pgVar7,Vol);
            Begin<short>((grid_iterator<short> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(short *)local_c0.Ptr = (short)(int)(local_80 * (double)(int)*(short *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.Ptr + (long)local_c0.S.field_0.field_0.X * 2)
              ;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               local_c0.S.field_0.field_0.Y * lVar4 * 2 +
                               (long)local_c0.D.field_0.field_0.X * -2);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 (long)local_c0.N.field_0.field_0.Y *
                                 local_c0.S.field_0.field_0.Z * lVar4 * 2 +
                                 local_c0.D.field_0.field_0.Y * lVar4 * -2);
                }
              }
            }
            break;
          case uint16:
            End<unsigned_short>((grid_iterator<unsigned_short> *)&local_68,pgVar7,Vol);
            Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(short *)local_c0.Ptr = (short)(int)(local_80 * (double)*(ushort *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.Ptr + (long)local_c0.S.field_0.field_0.X * 2)
              ;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               local_c0.S.field_0.field_0.Y * lVar4 * 2 +
                               (long)local_c0.D.field_0.field_0.X * -2);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 (long)local_c0.N.field_0.field_0.Y *
                                 local_c0.S.field_0.field_0.Z * lVar4 * 2 +
                                 local_c0.D.field_0.field_0.Y * lVar4 * -2);
                }
              }
            }
            break;
          case int32:
            End<int>((grid_iterator<int> *)&local_68,pgVar7,Vol);
            Begin<int>((grid_iterator<int> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(int *)local_c0.Ptr = (int)(local_80 * (double)(int)*(float *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.Ptr + (long)local_c0.S.field_0.field_0.X * 4)
              ;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               local_c0.S.field_0.field_0.Y * lVar4 * 4 +
                               (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 (long)local_c0.N.field_0.field_0.Y *
                                 local_c0.S.field_0.field_0.Z * lVar4 * 4 +
                                 local_c0.D.field_0.field_0.Y * lVar4 * -4);
                }
              }
            }
            break;
          case uint32:
            End<unsigned_int>((grid_iterator<unsigned_int> *)&local_68,pgVar7,Vol);
            Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(float *)local_c0.Ptr =
                   (float)(long)(local_80 * (double)(uint)*(float *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.Ptr + (long)local_c0.S.field_0.field_0.X * 4)
              ;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               local_c0.S.field_0.field_0.Y * lVar4 * 4 +
                               (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 (long)local_c0.N.field_0.field_0.Y *
                                 local_c0.S.field_0.field_0.Z * lVar4 * 4 +
                                 local_c0.D.field_0.field_0.Y * lVar4 * -4);
                }
              }
            }
            break;
          case int64:
            End<long>((grid_iterator<long> *)&local_68,pgVar7,Vol);
            Begin<long>((grid_iterator<long> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *local_c0.Ptr = (double)(long)(local_80 * (double)(long)*local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = local_c0.Ptr + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar4 -
                               (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar4 -
                                 local_c0.D.field_0.field_0.Y * lVar4);
                }
              }
            }
            break;
          case uint64:
            End<unsigned_long>((grid_iterator<unsigned_long> *)&local_68,pgVar7,Vol);
            Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_c0,pgVar7,Vol);
            auVar1 = _DAT_001bdf20;
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *local_c0.Ptr;
              auVar10 = vunpcklps_avx(auVar10,ZEXT816(0x4530000043300000));
              auVar10 = vsubpd_avx(auVar10,auVar1);
              dVar9 = local_80 * (auVar10._0_8_ + auVar10._8_8_);
              uVar5 = (ulong)dVar9;
              *local_c0.Ptr =
                   (double)((long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = local_c0.Ptr + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar4 -
                               (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar4 -
                                 local_c0.D.field_0.field_0.Y * lVar4);
                }
              }
            }
            break;
          case float32:
            End<float>((grid_iterator<float> *)&local_68,pgVar7,Vol);
            Begin<float>((grid_iterator<float> *)&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *(float *)local_c0.Ptr = (float)(local_80 * (double)*(float *)local_c0.Ptr);
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = (double *)((long)local_c0.Ptr + (long)local_c0.S.field_0.field_0.X * 4)
              ;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = (double *)
                               ((long)local_c0.Ptr +
                               local_c0.S.field_0.field_0.Y * lVar4 * 4 +
                               (long)local_c0.D.field_0.field_0.X * -4);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = (double *)
                                 ((long)local_c0.Ptr +
                                 (long)local_c0.N.field_0.field_0.Y *
                                 local_c0.S.field_0.field_0.Z * lVar4 * 4 +
                                 local_c0.D.field_0.field_0.Y * lVar4 * -4);
                }
              }
            }
            break;
          case float64:
            End<double>(&local_68,pgVar7,Vol);
            Begin<double>(&local_c0,pgVar7,Vol);
            auVar13 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            while (local_c0.Ptr != local_68.Ptr) {
              *local_c0.Ptr = local_80 * *local_c0.Ptr;
              local_c0.P.field_0.field_0.X =
                   local_c0.P.field_0.field_0.X + local_c0.S.field_0.field_0.X;
              local_c0.Ptr = local_c0.Ptr + local_c0.S.field_0.field_0.X;
              if (local_c0.D.field_0.field_0.X <= local_c0.P.field_0.field_0.X) {
                local_c0.P.field_0.field_0.X = 0;
                local_c0.P.field_0.field_0.Y =
                     local_c0.P.field_0.field_0.Y + local_c0.S.field_0.field_0.Y;
                lVar4 = (long)local_c0.N.field_0.field_0.X;
                local_c0.Ptr = local_c0.Ptr +
                               (local_c0.S.field_0.field_0.Y * lVar4 -
                               (long)local_c0.D.field_0.field_0.X);
                if (local_c0.D.field_0.field_0.Y <= local_c0.P.field_0.field_0.Y) {
                  local_c0.P.field_0.field_0.Y = 0;
                  local_c0.P.field_0.field_0.Z =
                       local_c0.P.field_0.field_0.Z + local_c0.S.field_0.field_0.Z;
                  local_c0.Ptr = local_c0.Ptr +
                                 ((long)local_c0.N.field_0.field_0.Y *
                                  local_c0.S.field_0.field_0.Z * lVar4 -
                                 local_c0.D.field_0.field_0.Y * lVar4);
                }
              }
            }
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_70->Size);
  }
  return;
}

Assistant:

void
ForwardCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  idx2_For (int, I, 0, TransformDetails.StackSize)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      FLiftCdf53X<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    case 1:                                                                                        \
      FLiftCdf53Y<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    case 2:                                                                                        \
      FLiftCdf53Z<type>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                           \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* Optionally normalize */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}